

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::makeipt(int nw,int *ip)

{
  int iVar1;
  int iVar2;
  int q;
  int p;
  int m2;
  int m;
  int l;
  int j;
  int *ip_local;
  int nw_local;
  
  ip[2] = 0;
  ip[3] = 0x10;
  m = 2;
  for (l = nw; 0x20 < l; l = l >> 2) {
    iVar2 = m * 2;
    for (j = m; j < iVar2; j = j + 1) {
      iVar1 = ip[j];
      ip[m + j] = iVar1 * 4;
      ip[iVar2 + j] = iVar1 * 4 + m * 0x10;
    }
    m = iVar2;
  }
  return;
}

Assistant:

void makeipt(int nw, int *ip) {
  int j, l, m, m2, p, q;

  ip[2] = 0;
  ip[3] = 16;
  m = 2;
  for (l = nw; l > 32; l >>= 2) {
    m2 = m << 1;
    q = m2 << 3;
    for (j = m; j < m2; j++) {
      p = ip[j] << 2;
      ip[m + j] = p;
      ip[m2 + j] = p + q;
    }
    m = m2;
  }
}